

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O0

int cpu_asidx_from_attrs(CPUState *cpu,MemTxAttrs attrs)

{
  MemTxAttrs in_stack_ffffffffffffffd8;
  int local_24;
  int ret;
  CPUClass *cc;
  CPUState *cpu_local;
  MemTxAttrs attrs_local;
  
  local_24 = 0;
  if ((cpu->cc->asidx_from_attrs != (_func_int_CPUState_ptr_MemTxAttrs_conflict *)0x0) &&
     ((local_24 = (*cpu->cc->asidx_from_attrs)((CPUState_conflict *)cpu,in_stack_ffffffffffffffd8),
      cpu->num_ases <= local_24 || (local_24 < 0)))) {
    __assert_fail("ret < cpu->num_ases && ret >= 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/include/hw/core/cpu.h"
                  ,0x1a5,"int cpu_asidx_from_attrs(CPUState *, MemTxAttrs)");
  }
  return local_24;
}

Assistant:

static inline int cpu_asidx_from_attrs(CPUState *cpu, MemTxAttrs attrs)
{
    CPUClass *cc = CPU_GET_CLASS(cpu);
    int ret = 0;

    if (cc->asidx_from_attrs) {
        ret = cc->asidx_from_attrs(cpu, attrs);
        assert(ret < cpu->num_ases && ret >= 0);
    }
    return ret;
}